

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O0

void __thiscall ChatWindow::connectedToServer(ChatWindow *this)

{
  bool bVar1;
  undefined4 in_stack_ffffffffffffff44;
  QFlags<Qt::InputMethodHint> local_88;
  QFlags<Qt::WindowType> local_84;
  QString local_80;
  QString local_58;
  QString local_40;
  undefined1 local_28 [8];
  QString newUsername;
  ChatWindow *this_local;
  
  newUsername.d.size = (qsizetype)this;
  tr(&local_40,"Chose Username",(char *)0x0,-1);
  tr(&local_58,"Username",(char *)0x0,-1);
  QString::QString(&local_80);
  QFlags<Qt::WindowType>::QFlags(&local_84);
  QFlags<Qt::InputMethodHint>::QFlags(&local_88,ImhNone);
  QInputDialog::getText
            ((QWidget *)local_28,(QString *)this,(QString *)&local_40,(EchoMode)&local_58,
             (QString *)0x0,(bool *)&local_80,(QFlags_conflict1 *)0x0,
             (QFlags_conflict1 *)CONCAT44(in_stack_ffffffffffffff44,local_84.i));
  QString::~QString(&local_80);
  QString::~QString(&local_58);
  QString::~QString(&local_40);
  bVar1 = QString::isEmpty((QString *)local_28);
  if (bVar1) {
    ChatClient::disconnectFromHost(this->m_chatClient);
  }
  else {
    attemptLogin(this,(QString *)local_28);
  }
  QString::~QString((QString *)local_28);
  return;
}

Assistant:

void ChatWindow::connectedToServer()
{
    // once we connected to the server we ask the user for what username they would like to use
    const QString newUsername = QInputDialog::getText(this, tr("Chose Username"), tr("Username"));
    if (newUsername.isEmpty()){
        // if the user clicked cancel or typed nothing, we just disconnect from the server
        return m_chatClient->disconnectFromHost();
    }
    // try to login with the given username
    attemptLogin(newUsername);
}